

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

size_t __thiscall
helics::ActionMessage::fromByteArray(ActionMessage *this,byte *data,size_t buffer_size)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t size;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  uint uVar5;
  pointer pbVar6;
  pointer pcVar7;
  size_t __n;
  size_t sVar8;
  uint8_t uVar9;
  undefined1 *puVar10;
  size_t ii;
  byte *pbVar11;
  long lVar12;
  size_t unaff_RBP;
  byte *st1_1;
  ulong uVar13;
  ulong uVar14;
  byte *st1;
  byte *pbVar15;
  ulong uVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  baseType timecode;
  uint32_t ssize;
  Time local_60;
  undefined4 local_54;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  if (fromByteArray(std::byte_const*,unsigned_long)::littleEndian == '\0') {
    fromByteArray();
  }
  if (0x2c < buffer_size) {
    if ((*data == 0xf3) && (unaff_RBP = depacketize(this,data,buffer_size), unaff_RBP != 0)) {
      return unaff_RBP;
    }
    uVar9 = fromByteArray::littleEndian;
    bVar1 = *data;
    if (bVar1 == 0x7b) {
      return 0;
    }
    uVar16 = (ulong)((uint)data[2] << 8 | (uint)data[1] << 0x10);
    bVar2 = data[3];
    uVar14 = uVar16 + bVar2 + 0x2d;
    if (uVar14 <= buffer_size) {
      this->messageAction = *(undefined4 *)(data + 4);
      if (bVar1 != uVar9) {
        pbVar11 = (byte *)((long)&this->messageAction + 3);
        lVar12 = 0;
        do {
          bVar3 = *(byte *)((long)(&(this->payload).buffer + -1) + lVar12);
          *(byte *)((long)(&(this->payload).buffer + -1) + lVar12) = *pbVar11;
          *pbVar11 = bVar3;
          lVar12 = lVar12 + 1;
          pbVar11 = pbVar11 + -1;
        } while (lVar12 == 1);
      }
      uVar16 = uVar16 | bVar2;
      this->messageID = *(undefined4 *)(data + 8);
      (this->source_id).gid = *(undefined4 *)(data + 0xc);
      (this->source_handle).hid = *(undefined4 *)(data + 0x10);
      (this->dest_id).gid = *(undefined4 *)(data + 0x14);
      (this->dest_handle).hid = *(undefined4 *)(data + 0x18);
      this->counter = *(undefined2 *)(data + 0x1c);
      this->flags = *(undefined2 *)(data + 0x1e);
      this->sequenceID = *(undefined4 *)(data + 0x20);
      (this->actionTime).internalTimeCode = *(undefined8 *)(data + 0x24);
      if (this->messageAction == cmd_time_request) {
        uVar14 = uVar16 + 0x45;
        if (buffer_size < uVar14) goto LAB_0033630d;
        (this->Te).internalTimeCode = *(undefined8 *)(data + 0x2c);
        (this->Tdemin).internalTimeCode = *(undefined8 *)(data + 0x34);
        (this->Tso).internalTimeCode = *(undefined8 *)(data + 0x3c);
        pbVar15 = data + 0x44;
      }
      else {
        pbVar15 = data + 0x2c;
        this->Te = 0;
        this->Tdemin = 0;
        (this->Tso).internalTimeCode = 0;
      }
      if (uVar16 != 0) {
        SmallBuffer::reserve(&this->payload,uVar16);
        (this->payload).bufferSize = uVar16;
        memcpy((this->payload).heap,pbVar15,uVar16);
        pbVar15 = pbVar15 + uVar16;
      }
      uVar13 = (ulong)*pbVar15;
      this_00 = &this->stringData;
      if (uVar13 == 0) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_00,
                          (this_00->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        local_48 = uVar13;
        local_38 = this_00;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(this_00,uVar13);
        uVar14 = uVar14 + local_48 * 4;
        if (buffer_size < uVar14) goto LAB_0033630d;
        pbVar15 = pbVar15 + 1;
        bVar17 = true;
        uVar13 = 0;
        local_50 = unaff_RBP;
        local_40 = uVar16;
        do {
          local_54 = *(undefined4 *)pbVar15;
          if (bVar1 != uVar9) {
            puVar10 = (undefined1 *)((long)&local_54 + 3);
            lVar12 = 0;
            do {
              uVar4 = *(undefined1 *)((long)&local_54 + lVar12);
              *(undefined1 *)((long)&local_54 + lVar12) = *puVar10;
              *puVar10 = uVar4;
              lVar12 = lVar12 + 1;
              puVar10 = puVar10 + -1;
            } while (lVar12 == 1);
          }
          uVar14 = uVar14 + (uint)local_54;
          if (buffer_size < uVar14) {
            this->messageAction = cmd_invalid;
            local_50 = 0;
            break;
          }
          pbVar6 = (local_38->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(pbVar6 + uVar13,0,pbVar6[uVar13]._M_string_length,(char *)(pbVar15 + 4),
                     (ulong)(uint)local_54);
          pbVar15 = pbVar15 + 4 + (uint)local_54;
          uVar13 = uVar13 + 1;
          bVar17 = uVar13 < local_48;
        } while (uVar13 != local_48);
        uVar16 = local_40;
        if (bVar17) {
          return local_50;
        }
      }
      if (bVar1 != uVar9) {
        puVar10 = (undefined1 *)((long)&this->messageID + 3);
        lVar12 = 4;
        do {
          uVar4 = *(undefined1 *)((long)(&(this->payload).buffer + -1) + lVar12);
          *(undefined1 *)((long)(&(this->payload).buffer + -1) + lVar12) = *puVar10;
          *puVar10 = uVar4;
          lVar12 = lVar12 + 1;
          puVar10 = puVar10 + -1;
        } while (lVar12 == 5);
        puVar10 = (undefined1 *)((long)&(this->source_id).gid + 3);
        lVar12 = 8;
        do {
          uVar4 = *(undefined1 *)((long)(&(this->payload).buffer + -1) + lVar12);
          *(undefined1 *)((long)(&(this->payload).buffer + -1) + lVar12) = *puVar10;
          *puVar10 = uVar4;
          lVar12 = lVar12 + 1;
          puVar10 = puVar10 + -1;
        } while (lVar12 == 9);
        puVar10 = (undefined1 *)((long)&(this->source_handle).hid + 3);
        lVar12 = 0xc;
        do {
          uVar4 = *(undefined1 *)((long)(&(this->payload).buffer + -1) + lVar12);
          *(undefined1 *)((long)(&(this->payload).buffer + -1) + lVar12) = *puVar10;
          *puVar10 = uVar4;
          lVar12 = lVar12 + 1;
          puVar10 = puVar10 + -1;
        } while (lVar12 == 0xd);
        puVar10 = (undefined1 *)((long)&(this->dest_id).gid + 3);
        lVar12 = 0x10;
        do {
          uVar4 = *(undefined1 *)((long)(&(this->payload).buffer + -1) + lVar12);
          *(undefined1 *)((long)(&(this->payload).buffer + -1) + lVar12) = *puVar10;
          *puVar10 = uVar4;
          lVar12 = lVar12 + 1;
          puVar10 = puVar10 + -1;
        } while (lVar12 == 0x11);
        puVar10 = (undefined1 *)((long)&(this->dest_handle).hid + 3);
        lVar12 = 0x14;
        do {
          uVar4 = *(undefined1 *)((long)(&(this->payload).buffer + -1) + lVar12);
          *(undefined1 *)((long)(&(this->payload).buffer + -1) + lVar12) = *puVar10;
          *puVar10 = uVar4;
          lVar12 = lVar12 + 1;
          puVar10 = puVar10 + -1;
        } while (lVar12 == 0x15);
        uVar13._0_2_ = this->counter;
        uVar13._2_2_ = this->flags;
        uVar13._4_4_ = this->sequenceID;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar13;
        auVar18 = psllw(auVar18,8);
        uVar5 = auVar18._0_4_ | CONCAT22((ushort)uVar13._2_2_ >> 8,(ushort)(undefined2)uVar13 >> 8);
        this->counter = (short)uVar5;
        this->flags = (short)(uVar5 >> 0x10);
        puVar10 = (undefined1 *)((long)&local_60.internalTimeCode + 7);
        local_60.internalTimeCode = (this->actionTime).internalTimeCode;
        lVar12 = 0;
        do {
          uVar4 = *(undefined1 *)((long)&local_60.internalTimeCode + lVar12);
          *(undefined1 *)((long)&local_60.internalTimeCode + lVar12) = *puVar10;
          *puVar10 = uVar4;
          lVar12 = lVar12 + 1;
          puVar10 = puVar10 + -1;
        } while (lVar12 != 4);
        (this->actionTime).internalTimeCode = local_60.internalTimeCode;
        if (this->messageAction == cmd_time_request) {
          puVar10 = (undefined1 *)((long)&local_60.internalTimeCode + 7);
          local_60.internalTimeCode = (this->Te).internalTimeCode;
          lVar12 = 0;
          do {
            uVar4 = *(undefined1 *)((long)&local_60.internalTimeCode + lVar12);
            *(undefined1 *)((long)&local_60.internalTimeCode + lVar12) = *puVar10;
            *puVar10 = uVar4;
            lVar12 = lVar12 + 1;
            puVar10 = puVar10 + -1;
          } while (lVar12 != 4);
          puVar10 = (undefined1 *)((long)&local_60.internalTimeCode + 7);
          (this->Te).internalTimeCode = local_60.internalTimeCode;
          local_60.internalTimeCode = (this->Tdemin).internalTimeCode;
          lVar12 = 0;
          do {
            uVar4 = *(undefined1 *)((long)&local_60.internalTimeCode + lVar12);
            *(undefined1 *)((long)&local_60.internalTimeCode + lVar12) = *puVar10;
            *puVar10 = uVar4;
            lVar12 = lVar12 + 1;
            puVar10 = puVar10 + -1;
          } while (lVar12 != 4);
          puVar10 = (undefined1 *)((long)&local_60.internalTimeCode + 7);
          (this->Tdemin).internalTimeCode = local_60.internalTimeCode;
          local_60.internalTimeCode = (this->Tso).internalTimeCode;
          lVar12 = 0;
          do {
            uVar4 = *(undefined1 *)((long)&local_60.internalTimeCode + lVar12);
            *(undefined1 *)((long)&local_60.internalTimeCode + lVar12) = *puVar10;
            *puVar10 = uVar4;
            lVar12 = lVar12 + 1;
            puVar10 = puVar10 + -1;
          } while (lVar12 != 4);
          (this->Tso).internalTimeCode = local_60.internalTimeCode;
        }
      }
      if ((int)uVar16 != 0xffffff) {
        return uVar14;
      }
      pbVar6 = (this->stringData).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->stringData).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == pbVar6) {
        return uVar14;
      }
      pcVar7 = pbVar6[-1]._M_dataplus._M_p;
      __n = pbVar6[-1]._M_string_length;
      sVar8 = (this->payload).bufferSize;
      size = sVar8 + __n;
      SmallBuffer::reserve(&this->payload,size);
      (this->payload).bufferSize = size;
      memcpy((this->payload).heap + sVar8,pcVar7,__n);
      pbVar6 = (this->stringData).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->stringData).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar6 + -1;
      pcVar7 = pbVar6[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar7 != &pbVar6[-1].field_2) {
        operator_delete(pcVar7,pbVar6[-1].field_2._M_allocated_capacity + 1);
        return uVar14;
      }
      return uVar14;
    }
  }
LAB_0033630d:
  this->messageAction = cmd_invalid;
  return 0;
}

Assistant:

std::size_t ActionMessage::fromByteArray(const std::byte* data, std::size_t buffer_size)
{
    std::size_t tsize{action_message_base_size};
    static const uint8_t littleEndian = isLittleEndian();
    if (buffer_size < tsize) {
        messageAction = CMD_INVALID;
        return (0);
    }
    if (data[0] == static_cast<std::byte>(LEADING_CHAR)) {
        auto res = depacketize(data, buffer_size);
        if (res > 0) {
            return static_cast<int>(res);
        }
    }
    // this means it probably is a JSON packate
    if (data[0] == std::byte{'{'}) {
        return 0;
    }
    const std::size_t size = 256ULL * 256ULL * (std::to_integer<std::size_t>(data[1])) +
        256ULL * std::to_integer<std::size_t>(data[2]) + std::to_integer<std::size_t>(data[3]);
    tsize += size;
    if (buffer_size < tsize) {
        messageAction = CMD_INVALID;
        return (0);
    }
    const bool swap = (data[0] != static_cast<std::byte>(littleEndian));
    data += sizeof(uint32_t);
    memcpy(&messageAction, data, sizeof(action_message_def::action_t));
    // messageAction = *reinterpret_cast<const action_message_def::action_t *> (data);
    if (swap) {
        swap_bytes<sizeof(action_message_def::action_t)>(
            reinterpret_cast<std::uint8_t*>(&messageAction));
    }
    data += sizeof(action_message_def::action_t);
    // messageID = *reinterpret_cast<const int32_t *> (data);
    memcpy(&messageID, data, sizeof(int32_t));
    data += sizeof(int32_t);
    // source_id = GlobalFederateId{*reinterpret_cast<const int32_t *> (data)};
    memcpy(source_id.getBaseTypePointer(), data, sizeof(GlobalFederateId::BaseType));
    data += sizeof(GlobalFederateId);
    // source_handle = InterfaceHandle{*reinterpret_cast<const int32_t *> (data)};
    memcpy(source_handle.getBaseTypePointer(), data, sizeof(InterfaceHandle::BaseType));
    data += sizeof(InterfaceHandle);
    // dest_id = GlobalFederateId{*reinterpret_cast<const int32_t *> (data)};
    memcpy(dest_id.getBaseTypePointer(), data, sizeof(GlobalFederateId::BaseType));
    data += sizeof(GlobalFederateId);
    // dest_handle = InterfaceHandle{*reinterpret_cast<const int32_t *> (data)};
    memcpy(dest_handle.getBaseTypePointer(), data, sizeof(InterfaceHandle::BaseType));
    data += sizeof(InterfaceHandle);
    // counter = *reinterpret_cast<const uint16_t *> (data);
    memcpy(&counter, data, sizeof(uint16_t));
    data += sizeof(uint16_t);
    // flags = *reinterpret_cast<const uint16_t *> (data);
    memcpy(&flags, data, sizeof(uint16_t));
    data += sizeof(uint16_t);
    // sequenceID = *reinterpret_cast<const uint32_t *> (data);
    memcpy(&sequenceID, data, sizeof(uint32_t));
    data += sizeof(uint32_t);
    Time::baseType btc;
    memcpy(&btc, data, sizeof(Time::baseType));
    actionTime.setBaseTimeCode(btc);
    data += sizeof(Time::baseType);

    if (messageAction == CMD_TIME_REQUEST) {
        tsize += 3 * sizeof(Time::baseType);
        if (buffer_size < tsize) {
            messageAction = CMD_INVALID;
            return (0);
        }
        memcpy(&btc, data, sizeof(Time::baseType));
        Te.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
        memcpy(&btc, data, sizeof(Time::baseType));
        Tdemin.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
        memcpy(&btc, data, sizeof(Time::baseType));
        Tso.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
    } else {
        Te = timeZero;
        Tdemin = timeZero;
        Tso = timeZero;
    }
    if (size > 0) {
        payload.assign(data, size);
        data += size;
    }
    auto stringCount = std::to_integer<std::size_t>(*data);
    ++data;
    if (stringCount != 0) {
        stringData.resize(stringCount);
        tsize += 4 * stringCount;
        if (buffer_size < tsize) {
            messageAction = CMD_INVALID;
            return (0);
        }

        for (std::size_t ii = 0; ii < stringCount; ++ii) {
            uint32_t ssize;
            memcpy(&ssize, data, sizeof(uint32_t));
            data += sizeof(uint32_t);
            if (swap) {
                swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&ssize));
            }
            tsize += ssize;
            if (buffer_size < tsize) {
                messageAction = CMD_INVALID;
                return (0);
            }
            stringData[ii].assign(reinterpret_cast<const char*>(data), ssize);
            data += ssize;
        }
    } else {
        stringData.clear();
    }

    if (swap) {
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&messageID));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&source_id));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&source_handle));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&dest_id));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&dest_handle));
        swap_bytes<2>(reinterpret_cast<std::uint8_t*>(&counter));
        swap_bytes<2>(reinterpret_cast<std::uint8_t*>(&flags));
        auto timecode = actionTime.getBaseTimeCode();
        swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
        actionTime.setBaseTimeCode(timecode);
        if (messageAction == CMD_TIME_REQUEST) {
            timecode = Te.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Te.setBaseTimeCode(timecode);
            timecode = Tdemin.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Tdemin.setBaseTimeCode(timecode);
            timecode = Tso.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Tso.setBaseTimeCode(timecode);
        }
    }
    if (size == maxPayloadSize && !stringData.empty()) {
        payload.append(stringData.back());
        stringData.pop_back();
    }
    return tsize;
}